

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void __thiscall
QtMWidgets::MsgBoxTitle::MsgBoxTitle(MsgBoxTitle *this,QString *title,QWidget *parent)

{
  MsgBoxTitlePrivate *this_00;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001b06e0;
  *(undefined ***)&this->field_0x10 = &PTR__MsgBoxTitle_001b0890;
  this_00 = (MsgBoxTitlePrivate *)operator_new(0x40);
  MsgBoxTitlePrivate::MsgBoxTitlePrivate(this_00,title,this);
  (this->d).d = this_00;
  MsgBoxTitlePrivate::init(this_00,(EVP_PKEY_CTX *)title);
  return;
}

Assistant:

explicit MsgBoxTitle( const QString & title, QWidget * parent = 0 )
		:	QWidget( parent )
		,	d( new MsgBoxTitlePrivate( title, this ) )
	{
		d->init();
	}